

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

bool __thiscall QFormLayoutItem::isHidden(QFormLayoutItem *this)

{
  QWidget *pQVar1;
  long in_RDI;
  undefined1 local_19;
  undefined1 local_9;
  
  local_9 = true;
  if ((*(byte *)(in_RDI + 9) & 1) != 0) {
    pQVar1 = widget((QFormLayoutItem *)0x4b977d);
    local_19 = false;
    if (pQVar1 != (QWidget *)0x0) {
      widget((QFormLayoutItem *)0x4b9796);
      local_19 = QWidget::isHidden((QWidget *)0x4b979e);
    }
    local_9 = local_19;
  }
  return local_9;
}

Assistant:

bool isHidden() const { return !isVisible || (widget() && widget()->isHidden()); }